

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfTiledInputSetFrameBuffer(ImfTiledInputFile *in,ImfRgba *base,size_t xStride,size_t yStride)

{
  ImfTiledInputFile *in_RDI;
  exception *e;
  size_t in_stack_00000188;
  size_t in_stack_00000190;
  Rgba *in_stack_00000198;
  TiledRgbaInputFile *in_stack_000001a0;
  
  anon_unknown.dwarf_572a3::infile(in_RDI);
  Imf_3_2::TiledRgbaInputFile::setFrameBuffer
            (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188);
  return 1;
}

Assistant:

int
ImfTiledInputSetFrameBuffer (
    ImfTiledInputFile* in, ImfRgba* base, size_t xStride, size_t yStride)
{
    try
    {
        infile (in)->setFrameBuffer (
            (OPENEXR_IMF_INTERNAL_NAMESPACE::Rgba*) base, xStride, yStride);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}